

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

void EvaluatePolicy(CMDP *PolicyMDP,int StartStateID,int GoalStateID,double *PolValue,
                   bool *bFullPolicy,double *Pcgoal,int *nMerges,bool *bCycles)

{
  CMDPSTATE *sourcestate;
  CMDPSTATE *targetstate;
  pointer ppCVar1;
  CMDPACTION *pCVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  SBPL_Exception *pSVar8;
  int oind;
  ulong uVar9;
  long lVar10;
  pointer ppCVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  double dVar18;
  pointer ppCVar19;
  undefined8 uVar20;
  double dVar21;
  double dVar22;
  allocator<char> local_221;
  pointer local_220;
  int local_214;
  long local_210;
  int local_204;
  bool *local_200;
  double local_1f8;
  double *local_1f0;
  double *local_1e8;
  void *local_1e0;
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  *Pcgoal = 0.0;
  *nMerges = 0;
  ppCVar11 = (PolicyMDP->StateArray).super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_220 = (PolicyMDP->StateArray).super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  uVar16 = (long)local_220 - (long)ppCVar11 >> 3;
  uVar9 = 0;
  uVar14 = -(ulong)(uVar16 >> 0x3d != 0) | (long)local_220 - (long)ppCVar11;
  local_214 = StartStateID;
  local_200 = bFullPolicy;
  local_1f0 = PolValue;
  local_1e8 = Pcgoal;
  pvVar6 = operator_new__(uVar14);
  pvVar7 = operator_new__(uVar14);
  uVar14 = 0;
  if (0 < (int)uVar16) {
    uVar14 = uVar16 & 0xffffffff;
  }
  uVar16 = 0xffffffffffffffff;
  for (; uVar14 != uVar9; uVar9 = uVar9 + 1) {
    *(undefined8 *)((long)pvVar6 + uVar9 * 8) = 0;
    uVar20 = 0x3ff0000000000000;
    bVar17 = ppCVar11[uVar9]->StateID != local_214;
    if (bVar17) {
      uVar20 = 0;
    }
    *(undefined8 *)((long)pvVar7 + uVar9 * 8) = uVar20;
    if (!bVar17) {
      uVar16 = uVar9;
    }
    uVar16 = uVar16 & 0xffffffff;
  }
  local_204 = (int)uVar16;
  *local_200 = true;
  dVar22 = 1000000000.0;
  bVar17 = true;
  local_1e0 = pvVar6;
  do {
    if (dVar22 <= 0.1) {
LAB_001462bf:
      *local_1f0 = *(double *)((long)pvVar6 + (long)local_204 * 8);
      return;
    }
    local_210 = 0;
    dVar22 = 0.0;
    while( true ) {
      uVar14 = (ulong)((long)local_220 - (long)ppCVar11) >> 3;
      iVar13 = (int)uVar14;
      if (iVar13 <= local_210) break;
      sourcestate = ppCVar11[local_210];
      if (sourcestate->StateID == GoalStateID) {
        *(undefined8 *)((long)pvVar6 + local_210 * 8) = 0;
        dVar21 = dVar22;
      }
      else {
        ppCVar1 = (sourcestate->Actions).
                  super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)(sourcestate->Actions).
                                super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1) >> 3) ==
            0) {
          *local_200 = false;
          *(undefined8 *)((long)pvVar6 + local_210 * 8) = 0x412e848000000000;
          goto LAB_001462bf;
        }
        pCVar2 = *ppCVar1;
        lVar15 = *(long *)&(pCVar2->SuccsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data;
        uVar9 = (ulong)((long)*(pointer *)
                               ((long)&(pCVar2->SuccsID).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) -
                       lVar15) >> 2;
        uVar16 = uVar9 & 0xffffffff;
        if ((int)uVar9 < 1) {
          uVar16 = 0;
        }
        dVar18 = 0.0;
        for (uVar9 = 0; uVar9 != uVar16; uVar9 = uVar9 + 1) {
          uVar12 = 0;
          while( true ) {
            if ((uVar14 & 0xffffffff) == uVar12) goto LAB_001462e5;
            if (ppCVar11[uVar12]->StateID == *(int *)(lVar15 + uVar9 * 4)) break;
            uVar12 = uVar12 + 1;
          }
          if (iVar13 == (int)uVar12) {
LAB_001462e5:
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1d8,"ERROR in EvaluatePolicy: incorrect successor ",
                       &local_221);
            std::__cxx11::stringstream::stringstream
                      ((stringstream *)&ss,(string *)&local_1d8,_S_out|_S_in);
            std::__cxx11::string::~string((string *)&local_1d8);
            std::ostream::operator<<
                      (local_1a8,
                       *(int *)(*(long *)&(pCVar2->SuccsID).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data + (uVar9 & 0xffffffff) * 4));
            pSVar8 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            SBPL_Exception::SBPL_Exception(pSVar8,&local_1d8);
            __cxa_throw(pSVar8,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
          }
          dVar18 = dVar18 + ((double)*(int *)(*(long *)&(pCVar2->Costs).
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + uVar9 * 4) +
                            *(double *)((long)pvVar6 + uVar12 * 8)) *
                            (double)*(float *)(*(long *)&(pCVar2->SuccsProb).
                                                                                                                  
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data + uVar9 * 4);
        }
        dVar21 = *(double *)((long)pvVar6 + local_210 * 8);
        if (dVar18 < dVar21) {
          pSVar8 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
          SBPL_Exception::SBPL_Exception(pSVar8,"ERROR in EvaluatePolicy: val is decreasing");
          __cxa_throw(pSVar8,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
        }
        dVar21 = dVar18 - dVar21;
        if (dVar21 <= dVar22) {
          dVar21 = dVar22;
        }
        *(double *)((long)pvVar6 + local_210 * 8) = dVar18;
      }
      ppCVar19 = (pointer)0x0;
      iVar13 = 0;
      local_1f8 = dVar21;
      for (lVar15 = 0; lVar15 < (int)((ulong)((long)local_220 - (long)ppCVar11) >> 3);
          lVar15 = lVar15 + 1) {
        lVar10 = 0;
        while( true ) {
          targetstate = ppCVar11[lVar15];
          ppCVar1 = (targetstate->Actions).
                    super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((int)((ulong)((long)(targetstate->Actions).
                                  super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1) >> 3) <
              1) break;
          pCVar2 = *ppCVar1;
          lVar3 = *(long *)&(pCVar2->SuccsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data;
          if ((int)((ulong)((long)*(pointer *)
                                   ((long)&(pCVar2->SuccsID).
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl + 8
                                   ) - lVar3) >> 2) <= lVar10) break;
          if (*(int *)(lVar3 + lVar10 * 4) == sourcestate->StateID) {
            local_220 = (pointer)((double)*(float *)(*(long *)&(pCVar2->SuccsProb).
                                                                                                                              
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data + lVar10 * 4) *
                                  *(double *)((long)pvVar7 + lVar15 * 8) + (double)ppCVar19);
            iVar13 = iVar13 + 1;
            ppCVar19 = local_220;
            if (((bVar17) && (*bCycles == false)) &&
               (bVar4 = PathExists(PolicyMDP,sourcestate,targetstate), ppCVar19 = local_220,
               dVar21 = local_1f8, bVar4)) {
              *bCycles = true;
            }
          }
          lVar10 = lVar10 + 1;
          ppCVar11 = (PolicyMDP->StateArray).
                     super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
        }
        local_220 = (PolicyMDP->StateArray).
                    super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      }
      iVar5 = sourcestate->StateID;
      if ((bVar17) && (0 < iVar13 && iVar5 != GoalStateID)) {
        *nMerges = *nMerges + iVar13 + -1;
        iVar5 = sourcestate->StateID;
      }
      if (iVar5 != local_214) {
        *(pointer *)((long)pvVar7 + local_210 * 8) = ppCVar19;
      }
      if (iVar5 == GoalStateID) {
        *local_1e8 = *(double *)((long)pvVar7 + local_210 * 8);
      }
      local_210 = local_210 + 1;
      pvVar6 = local_1e0;
      dVar22 = dVar21;
    }
    bVar17 = false;
  } while( true );
}

Assistant:

void EvaluatePolicy(CMDP* PolicyMDP, int StartStateID, int GoalStateID, double* PolValue, bool *bFullPolicy,
                    double* Pcgoal, int *nMerges, bool* bCycles)
{
    int i, j, startind = -1;
    double delta = INFINITECOST;
    double mindelta = 0.1;

    *Pcgoal = 0;
    *nMerges = 0;

    SBPL_PRINTF("Evaluating policy...\n");

    //create and initialize values
    double* vals = new double[PolicyMDP->StateArray.size()];
    double* Pcvals = new double[PolicyMDP->StateArray.size()];
    for (i = 0; i < (int)PolicyMDP->StateArray.size(); i++) {
        vals[i] = 0;
        Pcvals[i] = 0;

        //remember the start index
        if (PolicyMDP->StateArray[i]->StateID == StartStateID) {
            startind = i;
            Pcvals[i] = 1;
        }
    }

    //initially assume full policy
    *bFullPolicy = true;
    bool bFirstIter = true;
    while (delta > mindelta) {
        delta = 0;
        for (i = 0; i < (int)PolicyMDP->StateArray.size(); i++) {
            //get the state
            CMDPSTATE* state = PolicyMDP->StateArray[i];

            //do the backup for values
            if (state->StateID == GoalStateID) {
                vals[i] = 0;
            }
            else if ((int)state->Actions.size() == 0) {
                *bFullPolicy = false;
                vals[i] = UNKNOWN_COST;
                *PolValue = vals[startind];
                return;
            }
            else {
                //normal backup
                CMDPACTION* action = state->Actions[0];

                //do backup
                double Q = 0;
                for (int oind = 0; oind < (int)action->SuccsID.size(); oind++) {
                    //get the state
                    for (j = 0; j < (int)PolicyMDP->StateArray.size(); j++) {
                        if (PolicyMDP->StateArray[j]->StateID == action->SuccsID[oind]) break;
                    }
                    if (j == (int)PolicyMDP->StateArray.size()) {
                        std::stringstream ss("ERROR in EvaluatePolicy: incorrect successor ");
                        ss << action->SuccsID[oind];
                        throw SBPL_Exception(ss.str());
                    }
                    Q += action->SuccsProb[oind] * (vals[j] + action->Costs[oind]);
                }

                if (vals[i] > Q) {
                    throw SBPL_Exception("ERROR in EvaluatePolicy: val is decreasing");
                }

                //update delta
                if (delta < Q - vals[i]) delta = Q - vals[i];

                //set the value
                vals[i] = Q;
            }

            //iterate through all the predecessors and compute Pc
            double Pc = 0;
            //go over all predecessor states
            int nMerge = 0;
            for (j = 0; j < (int)PolicyMDP->StateArray.size(); j++) {
                for (int oind = 0; (int)PolicyMDP->StateArray[j]->Actions.size() > 0 &&
                                   oind < (int)PolicyMDP->StateArray[j]->Actions[0]->SuccsID.size(); oind++)
                {
                    if (PolicyMDP->StateArray[j]->Actions[0]->SuccsID[oind] == state->StateID) {
                        //process the predecessor
                        double PredPc = Pcvals[j];
                        double OutProb = PolicyMDP->StateArray[j]->Actions[0]->SuccsProb[oind];

                        //accumulate into Pc
                        Pc = Pc + OutProb * PredPc;
                        nMerge++;

                        //check for cycles
                        if (bFirstIter && !(*bCycles)) {
                            if (PathExists(PolicyMDP, state, PolicyMDP->StateArray[j])) *bCycles = true;
                        }
                    }
                }
            }
            if (bFirstIter && state->StateID != GoalStateID && nMerge > 0) *nMerges += (nMerge - 1);

            //assign Pc
            if (state->StateID != StartStateID) Pcvals[i] = Pc;

            if (state->StateID == GoalStateID) *Pcgoal = Pcvals[i];
        } //over  states
        bFirstIter = false;
    } //until delta small

    *PolValue = vals[startind];

    SBPL_PRINTF("done\n");
}